

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O2

IndexVector * __thiscall
Centaurus::NFABaseState<unsigned_char,_int>::epsilon_transitions
          (IndexVector *__return_storage_ptr__,NFABaseState<unsigned_char,_int> *this,
          bool *long_flag)

{
  pointer pNVar1;
  undefined8 in_RAX;
  NFATransition<unsigned_char> *i;
  pointer pNVar2;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  __return_storage_ptr__->_vptr_IndexVector = (_func_int **)&PTR__IndexVector_00197318;
  pNVar1 = (this->m_transitions).
           super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uStack_38 = in_RAX;
  for (pNVar2 = (this->m_transitions).
                super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pNVar2 != pNVar1; pNVar2 = pNVar2 + 1) {
    if ((pNVar2->m_label).m_ranges.
        super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pNVar2->m_label).m_ranges.
        super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uStack_38 = CONCAT44(pNVar2->m_dest,(undefined4)uStack_38);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,
                 (int *)((long)&uStack_38 + 4));
    }
    if (pNVar2->m_long == true) {
      *long_flag = true;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IndexVector epsilon_transitions(bool& long_flag) const
    {
        IndexVector ret;

        for (const auto& i : m_transitions)
        {
            if (i.is_epsilon())
            {
                ret.push_back(i.dest());
            }
            if (i.is_long())
            {
                long_flag = true;
            }
        }

        return ret;
    }